

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

ostream * Fixpp::details::
          FieldWriter<Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<711u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::ComponentBlock<Fixpp::TagT<311u,Fixpp::Type::String>,Fixpp::TagT<312u,Fixpp::Type::String>,Fixpp::TagT<309u,Fixpp::Type::String>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<457u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>,Fixpp::TagT<462u,Fixpp::Type::Int>,Fixpp::TagT<463u,Fixpp::Type::String>,Fixpp::TagT<310u,Fixpp::Type::String>,Fixpp::TagT<763u,Fixpp::Type::String>,Fixpp::TagT<313u,Fixpp::Type::String>,Fixpp::TagT<542u,Fixpp::Type::String>,Fixpp::TagT<241u,Fixpp::Type::String>,Fixpp::TagT<242u,Fixpp::Type::String>,Fixpp::TagT<243u,Fixpp::Type::Int>,Fixpp::TagT<244u,Fixpp::Type::Int>,Fixpp::TagT<245u,Fixpp::Type::Float>,Fixpp::TagT<246u,Fixpp::Type::Float>,Fixpp::TagT<256u,Fixpp::Type::String>,Fixpp::TagT<595u,Fixpp::Type::String>,Fixpp::TagT<592u,Fixpp::Type::String>,Fixpp::TagT<593u,Fixpp::Type::Strin...pp::SizeHint<10ul>,Fixpp::TagT<888u,Fixpp::Type::String>,Fixpp::TagT<889u,Fixpp::Type::String>>>>>>>
          ::
          write<Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<711u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::ComponentBlock<Fixpp::TagT<311u,Fixpp::Type::String>,Fixpp::TagT<312u,Fixpp::Type::String>,Fixpp::TagT<309u,Fixpp::Type::String>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<457u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>,Fixpp::TagT<462u,Fixpp::Type::Int>,Fixpp::TagT<463u,Fixpp::Type::String>,Fixpp::TagT<310u,Fixpp::Type::String>,Fixpp::TagT<763u,Fixpp::Type::String>,Fixpp::TagT<313u,Fixpp::Type::String>,Fixpp::TagT<542u,Fixpp::Type::String>,Fixpp::TagT<241u,Fixpp::Type::String>,Fixpp::TagT<242u,Fixpp::Type::String>,Fixpp::TagT<243u,Fixpp::Type::Int>,Fixpp::TagT<244u,Fixpp::Type::Int>,Fixpp::TagT<245u,Fixpp::Type::Float>,Fixpp::TagT<246u,Fixpp::Type::Float>,Fixpp::TagT<256u,Fixpp::Type::String>,Fixpp::TagT<595u,Fixpp::Type::String>,Fixpp::TagT<592u,Fixpp::Type::String>,Fixpp::TagT<593u,Fixpp::Type::String>,Fix___pp::SizeHint<10ul>,Fixpp::TagT<888u,Fixpp::Type::String>,Fixpp::TagT<889u,Fixpp::Type::String>>>>>>>
                    (ostream *os,Field<_b8373603_> *field)

{
  const_iterator pIVar1;
  ostream *poVar2;
  size_t sVar3;
  Type *pTVar4;
  InstanceGroup<_b8373603_> *instance;
  const_iterator __end0;
  const_iterator __begin0;
  Type *__range3;
  Type *group;
  Field<_b8373603_> *field_local;
  ostream *os_local;
  
  poVar2 = (ostream *)std::ostream::operator<<(os,0x2c7);
  poVar2 = std::operator<<(poVar2,"=");
  sVar3 = Field<$b8373603$>::size(field);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::operator<<(poVar2,'|');
  pTVar4 = Field<$b8373603$>::get(field);
  pIVar1 = (const_iterator)
           (pTVar4->super_SmallVectorImpl<_a3d882d6_>).super_SmallVectorTemplateBase<_3b957e65_>.
           super_SmallVectorTemplateCommon<_5cca3c12_>.super_SmallVectorBase.EndX;
  for (__end0 = (const_iterator)
                (pTVar4->super_SmallVectorImpl<_a3d882d6_>).
                super_SmallVectorTemplateBase<_3b957e65_>.
                super_SmallVectorTemplateCommon<_5cca3c12_>.super_SmallVectorBase.BeginX;
      __end0 != pIVar1; __end0 = __end0 + 1) {
    FieldWriter<$e636abe6$>::doWriteGroupFields<_615b6871_>(os,__end0);
  }
  return os;
}

Assistant:

static std::ostream& write(std::ostream& os, const FieldT& field)
        {
            os << GroupTag::Id << "=" << field.size() << SOH;

            static constexpr size_t GroupSize = FieldT::TotalTags;

            const auto& group = field.get();
            for (const auto& instance: group)
            {
                doWriteGroupFields(os, instance, meta::seq::make_index_sequence<GroupSize>{});
            }

            return os;
        }